

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AnonymousProgramSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AnonymousProgramSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,SyntaxList<slang::syntax::MemberSyntax> *args_3,Token *args_4)

{
  Token semi;
  Token keyword;
  Token endkeyword;
  AnonymousProgramSyntax *pAVar1;
  SyntaxList<slang::syntax::MemberSyntax> *in_RCX;
  undefined8 *in_RDX;
  Info *in_RSI;
  Info *in_R9;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pAVar1 = (AnonymousProgramSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  keyword.info = in_R9;
  keyword._0_8_ = in_RDX[1];
  semi.info = (Info *)*in_RDX;
  semi._0_8_ = *(undefined8 *)&(in_RCX->super_SyntaxListBase).super_SyntaxNode;
  endkeyword.info = in_RSI;
  endkeyword._0_8_ = in_RDX;
  slang::syntax::AnonymousProgramSyntax::AnonymousProgramSyntax
            ((AnonymousProgramSyntax *)(in_RCX->super_SyntaxListBase)._vptr_SyntaxListBase,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_R9->location,keyword,semi,
             in_RCX,endkeyword);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }